

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O1

UCVarValue FBaseCVar::FromGUID(GUID *guid,ECVarType type)

{
  UCVarValue ret;
  GUID *local_10;
  
  switch(type) {
  case CVAR_Bool:
    local_10 = (GUID *)((ulong)local_10 & 0xffffffffffffff00);
    break;
  case CVAR_Int:
  case CVAR_Float:
    local_10 = (GUID *)((ulong)local_10 & 0xffffffff00000000);
    break;
  case CVAR_String:
    FormatGUID(cstrbuf,0x28,guid);
    local_10 = (GUID *)cstrbuf;
    break;
  case CVAR_GUID:
    local_10 = guid;
  }
  return (UCVarValue)local_10.String;
}

Assistant:

UCVarValue FBaseCVar::FromGUID (const GUID &guid, ECVarType type)
{
	UCVarValue ret;

	switch (type)
	{
	case CVAR_Bool:
		ret.Bool = false;
		break;

	case CVAR_Int:
		ret.Int = 0;
		break;

	case CVAR_Float:
		ret.Float = 0.f;
		break;

	case CVAR_String:
		ret.pGUID = &guid;
		ret.String = ToString (ret, CVAR_GUID);
		break;

	case CVAR_GUID:
		ret.pGUID = &guid;
		break;

	default:
		break;
	}

	return ret;
}